

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildReservedRange
          (DescriptorBuilder *this,ReservedRange *proto,Descriptor *parent,ReservedRange *result)

{
  int32 iVar1;
  string *element_name;
  ReservedRange *result_local;
  Descriptor *parent_local;
  ReservedRange *proto_local;
  DescriptorBuilder *this_local;
  
  iVar1 = DescriptorProto_ReservedRange::start(proto);
  result->start = iVar1;
  iVar1 = DescriptorProto_ReservedRange::end(proto);
  result->end = iVar1;
  if (result->start < 1) {
    element_name = Descriptor::full_name_abi_cxx11_(parent);
    AddError(this,element_name,&proto->super_Message,NUMBER,
             "Reserved numbers must be positive integers.");
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildReservedRange(
    const DescriptorProto::ReservedRange& proto,
    const Descriptor* parent,
    Descriptor::ReservedRange* result) {
  result->start = proto.start();
  result->end = proto.end();
  if (result->start <= 0) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Reserved numbers must be positive integers.");
  }
}